

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_tx_cb(void *arg)

{
  udp_ep *ep;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 8));
  udp_finish_tx((udp_ep *)arg);
  nni_mtx_unlock((nni_mtx *)((long)arg + 8));
  return;
}

Assistant:

static void
udp_tx_cb(void *arg)
{
	udp_ep *ep = arg;

	nni_mtx_lock(&ep->mtx);
	udp_finish_tx(ep);
	nni_mtx_unlock(&ep->mtx);
}